

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags.h
# Opt level: O0

void __thiscall
AutoArgParse::ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger>::printUsageSummary
          (ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger> *this,ostream *os)

{
  bool bVar1;
  bool bVar2;
  reference __k;
  FlagMap *this_00;
  mapped_type *this_01;
  pointer pFVar3;
  mapped_type *flagObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *flag;
  const_iterator __end2;
  const_iterator __begin2;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool first;
  ostream *os_local;
  ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger> *this_local;
  
  bVar1 = std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->flags);
  if (!bVar1) {
    bVar1 = true;
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((const_iterator *)&__end2._M_node,&this->flags);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((const_iterator *)&flag,&this->flags);
    while (bVar2 = std::operator!=((_Self *)&__end2._M_node,(_Self *)&flag), bVar2) {
      __k = std::
            _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
            ::operator*((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                         *)&__end2._M_node);
      this_00 = ComplexFlag<AutoArgParse::DoNothingTrigger>::getFlagMap_abi_cxx11_(this->parentFlag)
      ;
      this_01 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>_>_>
                ::at(this_00,__k);
      if (bVar1) {
        bVar1 = false;
      }
      else {
        std::operator<<(os,"|");
      }
      std::operator<<(os,(string *)__k);
      pFVar3 = std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>
               ::operator->(this_01);
      (*(pFVar3->super_ParseToken)._vptr_ParseToken[4])(pFVar3,os);
      std::
      _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
      ::operator++((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                    *)&__end2._M_node);
    }
  }
  return;
}

Assistant:

inline virtual void printUsageSummary(std::ostream& os) const {
        if (flags.empty()) {
            return;
        }
        bool first = true;
        for (const auto& flag : flags) {
            auto& flagObj = parentFlag.getFlagMap().at(flag);
            if (first) {
                first = false;
            } else {
                os << "|";
            }
            os << flag;
            flagObj->printUsageSummary(os);
        }
    }